

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationDriveline::IntStateGatherReactions
          (ChLinkMotorRotationDriveline *this,uint off_L,ChVectorDynamic<> *L)

{
  int iVar1;
  element_type *peVar2;
  
  ChLinkMateGeneric::IntStateGatherReactions((ChLinkMateGeneric *)this,off_L,L);
  iVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  peVar2 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])(peVar2,(ulong)(iVar1 + off_L),L);
  peVar2 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
            (peVar2,(ulong)(iVar1 + 1 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    // First, inherit to parent class
    ChLinkMotorRotation::IntStateGatherReactions(off_L, L);

    int nc = mask.nconstr;
    innerconstraint1->IntStateGatherReactions(off_L + nc + 0, L);
    innerconstraint2->IntStateGatherReactions(off_L + nc + 1, L);
}